

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

double js_math_round(double a)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  JSFloat64Union u;
  
  uVar2 = (uint)((ulong)a >> 0x34) & 0x7ff;
  if (uVar2 < 0x3ff) {
    dVar1 = (double)((ulong)a & 0x8000000000000000);
    if (a != -0.5 && uVar2 == 0x3fe) {
      dVar1 = (double)((ulong)dVar1 | 0x3ff0000000000000);
    }
    return dVar1;
  }
  if (uVar2 < 0x433) {
    uVar3 = 1L << (0x33U - (char)uVar2 & 0x3f);
    a = (double)(-uVar3 & ((long)a >> 0x3f) + (long)a + (uVar3 >> 1));
  }
  return a;
}

Assistant:

static double js_math_round(double a)
{
    JSFloat64Union u;
    uint64_t frac_mask, one;
    unsigned int e, s;

    u.d = a;
    e = (u.u64 >> 52) & 0x7ff;
    if (e < 1023) {
        /* abs(a) < 1 */
        if (e == (1023 - 1) && u.u64 != 0xbfe0000000000000) {
            /* abs(a) > 0.5 or a = 0.5: return +/-1.0 */
            u.u64 = (u.u64 & ((uint64_t)1 << 63)) | ((uint64_t)1023 << 52);
        } else {
            /* return +/-0.0 */
            u.u64 &= (uint64_t)1 << 63;
        }
    } else if (e < (1023 + 52)) {
        s = u.u64 >> 63;
        one = (uint64_t)1 << (52 - (e - 1023));
        frac_mask = one - 1;
        u.u64 += (one >> 1) - s;
        u.u64 &= ~frac_mask; /* truncate to an integer */
    }
    /* otherwise: abs(a) >= 2^52, or NaN, +/-Infinity: no change */
    return u.d;
}